

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void zcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = (uint)env->features;
  if ((uVar4 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar3 = env->uncached_cpsr & 0x1f;
      if (uVar3 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar3 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar3 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((env->features >> 0x21 & 1) != 0) {
          bVar5 = uVar3 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar4 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar5)) goto LAB_00622bea;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00622bea:
  uVar1 = sve_zcr_len_for_el_aarch64(env,uVar4);
  raw_write(env,ri,(ulong)((uint)value & 0xf));
  uVar2 = sve_zcr_len_for_el_aarch64(env,uVar4);
  if (uVar1 <= uVar2) {
    return;
  }
  aarch64_sve_narrow_vq_aarch64(env,uVar2 + 1);
  return;
}

Assistant:

static void zcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                      uint64_t value)
{
    int cur_el = arm_current_el(env);
    int old_len = sve_zcr_len_for_el(env, cur_el);
    int new_len;

    /* Bits other than [3:0] are RAZ/WI.  */
    QEMU_BUILD_BUG_ON(ARM_MAX_VQ > 16);
    raw_write(env, ri, value & 0xf);

    /*
     * Because we arrived here, we know both FP and SVE are enabled;
     * otherwise we would have trapped access to the ZCR_ELn register.
     */
    new_len = sve_zcr_len_for_el(env, cur_el);
    if (new_len < old_len) {
        aarch64_sve_narrow_vq(env, new_len + 1);
    }
}